

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _Alloc_hider this_00;
  Descriptor *in_R8;
  long lVar4;
  string local_70;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "/**\n * Deserializes binary data (in protobuf wire format).\n * @param {jspb.ByteSource} bytes The bytes to deserialize.\n * @return {!$class$}\n */\n$class$.deserializeBinary = function(bytes) {\n  var reader = new jspb.BinaryReader(bytes);\n  var msg = new $class$;\n  return $class$.deserializeBinaryFromReader(msg, reader);\n};\n\n\n/**\n * Deserializes binary data (in protobuf wire format) from the\n * given reader into the given message object.\n * @param {!$class$} msg The message object to deserialize into.\n * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n * @return {!$class$}\n */\n$class$.deserializeBinaryFromReader = function(msg, reader) {\n  while (reader.nextField()) {\n    if (reader.isEndGroup()) {\n      break;\n    }\n    var field = reader.getFieldNumber();\n    switch (field) {\n"
                     ,"class",&local_70);
  this_00._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(desc + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)(desc + 0x30);
      if (*(char *)(lVar2 + 0x50 + lVar3) == '\x01') {
        this_00._M_p = (pointer)**(undefined8 **)(*(long *)(lVar2 + 0x58 + lVar3) + 0x10);
        iVar1 = std::__cxx11::string::compare(this_00._M_p);
        if (iVar1 != 0) {
          lVar2 = *(long *)(desc + 0x30);
          goto LAB_0022020e;
        }
      }
      else {
LAB_0022020e:
        GenerateClassDeserializeBinaryField
                  ((Generator *)this_00._M_p,options,printer,(FieldDescriptor *)(lVar2 + lVar3));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x2c));
  }
  io::Printer::Print(printer,"    default:\n");
  if (*(int *)(desc + 0x68) < 1) {
    io::Printer::Print(printer,"      reader.skipField();\n      break;\n");
  }
  else {
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    io::Printer::Print(printer,
                       "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n        $class$.prototype.getExtension,\n        $class$.prototype.setExtension);\n      break;\n"
                       ,"extobj",&local_70,"class",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Print(printer,"    }\n  }\n  return msg;\n};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinary(const GeneratorOptions& options,
                                               io::Printer* printer,
                                               const Descriptor* desc) const {
  // TODO(cfallin): Handle lazy decoding when requested by field option and/or
  // by default for 'bytes' fields and packed repeated fields.

  printer->Print(
      "/**\n"
      " * Deserializes binary data (in protobuf wire format).\n"
      " * @param {jspb.ByteSource} bytes The bytes to deserialize.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinary = function(bytes) {\n"
      "  var reader = new jspb.BinaryReader(bytes);\n"
      "  var msg = new $class$;\n"
      "  return $class$.deserializeBinaryFromReader(msg, reader);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Deserializes binary data (in protobuf wire format) from the\n"
      " * given reader into the given message object.\n"
      " * @param {!$class$} msg The message object to deserialize into.\n"
      " * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinaryFromReader = function(msg, reader) {\n"
      "  while (reader.nextField()) {\n"
      "    if (reader.isEndGroup()) {\n"
      "      break;\n"
      "    }\n"
      "    var field = reader.getFieldNumber();\n"
      "    switch (field) {\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassDeserializeBinaryField(options, printer, desc->field(i));
    }
  }

  printer->Print(
      "    default:\n");
  if (IsExtendable(desc)) {
    printer->Print(
        "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n"
        "        $class$.prototype.getExtension,\n"
        "        $class$.prototype.setExtension);\n"
        "      break;\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  } else {
    printer->Print(
        "      reader.skipField();\n"
        "      break;\n");
  }

  printer->Print(
      "    }\n"
      "  }\n"
      "  return msg;\n"
      "};\n"
      "\n"
      "\n");
}